

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O3

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  void *pvVar1;
  Allocator *pAVar2;
  int iVar3;
  int *piVar4;
  float fVar5;
  Mat local_98;
  Mat local_58;
  
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,0,&local_58);
  piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (&this->min_sizes != &local_98) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->min_sizes).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->min_sizes).data;
        pAVar2 = (this->min_sizes).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->min_sizes).data = local_98.data;
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->min_sizes).refcount = piVar4;
    (this->min_sizes).elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    (this->min_sizes).packing = local_98.packing;
    (this->min_sizes).allocator = local_98.allocator;
    (this->min_sizes).dims = local_98.dims;
    (this->min_sizes).w = local_98.w;
    (this->min_sizes).h = local_98.h;
    (this->min_sizes).c = local_98.c;
    (this->min_sizes).cstep = local_98.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.packing = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar4 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,1,&local_58);
  piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (&this->max_sizes != &local_98) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->max_sizes).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->max_sizes).data;
        pAVar2 = (this->max_sizes).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->max_sizes).data = local_98.data;
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->max_sizes).refcount = piVar4;
    (this->max_sizes).elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    (this->max_sizes).packing = local_98.packing;
    (this->max_sizes).allocator = local_98.allocator;
    (this->max_sizes).dims = local_98.dims;
    (this->max_sizes).w = local_98.w;
    (this->max_sizes).h = local_98.h;
    (this->max_sizes).c = local_98.c;
    (this->max_sizes).cstep = local_98.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.packing = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar4 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,2,&local_58);
  piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (&this->aspect_ratios != &local_98) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->aspect_ratios).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->aspect_ratios).data;
        pAVar2 = (this->aspect_ratios).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->aspect_ratios).data = local_98.data;
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->aspect_ratios).refcount = piVar4;
    (this->aspect_ratios).elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
    ;
    (this->aspect_ratios).packing = local_98.packing;
    (this->aspect_ratios).allocator = local_98.allocator;
    (this->aspect_ratios).dims = local_98.dims;
    (this->aspect_ratios).w = local_98.w;
    (this->aspect_ratios).h = local_98.h;
    (this->aspect_ratios).c = local_98.c;
    (this->aspect_ratios).cstep = local_98.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.packing = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar4 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  fVar5 = ParamDict::get(pd,3,0.1);
  this->variances[0] = fVar5;
  fVar5 = ParamDict::get(pd,4,0.1);
  this->variances[1] = fVar5;
  fVar5 = ParamDict::get(pd,5,0.2);
  this->variances[2] = fVar5;
  fVar5 = ParamDict::get(pd,6,0.2);
  this->variances[3] = fVar5;
  iVar3 = ParamDict::get(pd,7,1);
  this->flip = iVar3;
  iVar3 = ParamDict::get(pd,8,0);
  this->clip = iVar3;
  iVar3 = ParamDict::get(pd,9,0);
  this->image_width = iVar3;
  iVar3 = ParamDict::get(pd,10,0);
  this->image_height = iVar3;
  fVar5 = ParamDict::get(pd,0xb,-233.0);
  this->step_width = fVar5;
  fVar5 = ParamDict::get(pd,0xc,-233.0);
  this->step_height = fVar5;
  fVar5 = ParamDict::get(pd,0xd,0.0);
  this->offset = fVar5;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.1f);
    variances[1] = pd.get(4, 0.1f);
    variances[2] = pd.get(5, 0.2f);
    variances[3] = pd.get(6, 0.2f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);

    return 0;
}